

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O2

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btVector3 *pivotInA,
          btVector3 *pivotInB,btVector3 *axisInA,btVector3 *axisInB,bool useReferenceFrameA)

{
  undefined1 auVar1 [12];
  float fVar2;
  undefined8 uVar3;
  btScalar bVar4;
  btScalar bVar5;
  float fVar6;
  btScalar bVar7;
  btScalar bVar8;
  btScalar bVar9;
  btScalar bVar10;
  btVector3 bVar11;
  btVector3 local_78;
  btVector3 *local_68;
  btVector3 local_60;
  btVector3 rbAxisB1;
  btQuaternion rotationArc;
  
  local_68 = pivotInB;
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA,rbB)
  ;
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_001f1380;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  uVar3 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar3;
  fVar2 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  bVar5 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
  fVar6 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  local_78.m_floats[1] = fVar6;
  local_78.m_floats[0] = fVar2;
  local_78.m_floats[2] = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0]
  ;
  local_78.m_floats[3] = 0.0;
  fVar6 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0] *
          axisInA->m_floats[2] + axisInA->m_floats[0] * fVar2 + fVar6 * axisInA->m_floats[1];
  if (0.9999999 <= fVar6) {
    bVar4 = -bVar5;
    bVar9 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    bVar8 = -bVar9;
    bVar7 = -(rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    auVar1._8_4_ = bVar7;
    auVar1._0_8_ = CONCAT44(bVar9,bVar5) ^ 0x8000000080000000;
    bVar9 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    bVar5 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
  }
  else {
    if (-0.9999999 < fVar6) {
      local_60 = btVector3::cross(axisInA,&local_78);
      local_78 = btVector3::cross(&local_60,axisInA);
      bVar7 = local_78.m_floats[2];
      bVar4 = local_78.m_floats[0];
      bVar8 = local_78.m_floats[1];
      bVar5 = local_60.m_floats[1];
      bVar9 = local_60.m_floats[0];
      bVar10 = local_60.m_floats[2];
      goto LAB_00174009;
    }
    bVar4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    bVar5 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    bVar8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    bVar7 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    auVar1._4_4_ = bVar8;
    auVar1._0_4_ = bVar4;
    auVar1._8_4_ = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    bVar9 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  }
  local_78.m_floats[3] = 0.0;
  local_78.m_floats[0] = (btScalar)auVar1._0_4_;
  local_78.m_floats[1] = (btScalar)auVar1._4_4_;
  local_78.m_floats[2] = (btScalar)auVar1._8_4_;
  bVar10 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
  local_60.m_floats[1] = bVar5;
  local_60.m_floats[0] = bVar9;
  local_60.m_floats[2] = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1]
  ;
  local_60.m_floats[3] = 0.0;
LAB_00174009:
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[0] = bVar4;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[1] = bVar9;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[2] = axisInA->m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[0] = bVar8;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[1] = bVar5;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[2] = axisInA->m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[0] = bVar7;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[1] = bVar10;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[2] = axisInA->m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  rotationArc = shortestArcQuat(axisInA,axisInB);
  rbAxisB1 = quatRotate(&rotationArc,&local_78);
  bVar11 = btVector3::cross(axisInB,&rbAxisB1);
  uVar3 = *(undefined8 *)(local_68->m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_origin.m_floats = *(undefined8 *)local_68->m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_origin.m_floats + 2) = uVar3;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[0] = rbAxisB1.m_floats[0];
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[1] = bVar11.m_floats[0];
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[2] = axisInB->m_floats[0];
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[0] = rbAxisB1.m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[1] = bVar11.m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[2] = axisInB->m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[0] = rbAxisB1.m_floats[2];
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[1] = bVar11.m_floats[2];
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[2] = axisInB->m_floats[2];
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  if (this->m_useReferenceFrameA == false) {
    bVar5 = 1.0;
  }
  else {
    bVar5 = -1.0;
  }
  this->m_referenceSign = bVar5;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,btRigidBody& rbB, const btVector3& pivotInA,const btVector3& pivotInB,
									 const btVector3& axisInA,const btVector3& axisInB, bool useReferenceFrameA)
									 :btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA,rbB),
#ifdef _BT_USE_CENTER_LIMIT_
									 m_limit(),
#endif
									 m_angularOnly(false),
									 m_enableAngularMotor(false),
									 m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
									 m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
									 m_useReferenceFrameA(useReferenceFrameA),
									 m_flags(0),
									 m_normalCFM(0),
									 m_normalERP(0),
									 m_stopCFM(0),
									 m_stopERP(0)
{
	m_rbAFrame.getOrigin() = pivotInA;
	
	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	btVector3 rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(0);

	btVector3 rbAxisA2;
	btScalar projection = axisInA.dot(rbAxisA1);
	if (projection >= 1.0f - SIMD_EPSILON) {
		rbAxisA1 = -rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);
	} else if (projection <= -1.0f + SIMD_EPSILON) {
		rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);      
	} else {
		rbAxisA2 = axisInA.cross(rbAxisA1);
		rbAxisA1 = rbAxisA2.cross(axisInA);
	}

	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 =  axisInB.cross(rbAxisB1);	
	
	m_rbBFrame.getOrigin() = pivotInB;
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}